

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  _Invoker_type p_Var4;
  _Manager_type p_Var5;
  Column_dimension_option CVar6;
  ID_index IVar7;
  bool bVar8;
  ID_index IVar9;
  long lVar10;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar11;
  Column *col;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar12;
  ID_index IVar13;
  long lVar14;
  long lVar15;
  anon_class_1_0_00000001 local_47;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  Index local_44;
  anon_class_8_1_e4bd5e45 local_40;
  ulong local_38;
  
  p_Var4 = this[1].deathComp_._M_invoker;
  lVar14 = (ulong)columnIndex1 * 0x40;
  lVar15 = (ulong)columnIndex2 * 0x40;
  pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
             *)(p_Var4 + lVar15);
  local_44 = columnIndex2;
  if (*(int *)(p_Var4 + lVar14 + 0x18) == -1) {
    local_40.targetColumn._0_4_ = columnIndex1;
    if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001b386a:
      local_40.targetColumn._0_4_ = columnIndex1;
      std::__throw_bad_function_call();
    }
    bVar8 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_40,&local_44);
    p_Var4 = this[1].deathComp_._M_invoker;
    if ((bVar8) && ((pIVar12->super_Chain_column_option).pairedColumn_ == 0xffffffff)) {
      pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                 *)(p_Var4 + lVar15);
      IVar13 = *(ID_index *)(p_Var4 + lVar15 + 0x14);
      pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                 *)(p_Var4 + lVar14);
      local_40.targetColumn = pIVar12;
      bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::___e_matrix::Column_types)7,true,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar11,pIVar12,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar8) {
        CVar6.dim_ = (pIVar12->super_Column_dimension_option).dim_;
        IVar7 = (pIVar12->super_Chain_column_option).pivot_;
        IVar9 = (pIVar11->super_Chain_column_option).pivot_;
        pIVar12->super_Column_dimension_option =
             (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
        (pIVar12->super_Chain_column_option).pivot_ = IVar9;
        pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
        (pIVar11->super_Chain_column_option).pivot_ = IVar7;
      }
      IVar9 = (pIVar12->super_Chain_column_option).pivot_;
      local_38._0_4_ = columnIndex1;
      if (IVar13 == IVar9) {
        return columnIndex1;
      }
      goto LAB_001b3840;
    }
    IVar13 = *(ID_index *)(p_Var4 + lVar14 + 0x14);
LAB_001b37f8:
    pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
               *)(p_Var4 + lVar14);
    pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
               *)(p_Var4 + lVar15);
    local_40.targetColumn = pIVar12;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::___e_matrix::Column_types)7,true,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar11,pIVar12,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar8) {
      CVar6.dim_ = (pIVar12->super_Column_dimension_option).dim_;
      IVar7 = (pIVar12->super_Chain_column_option).pivot_;
      IVar9 = (pIVar11->super_Chain_column_option).pivot_;
      pIVar12->super_Column_dimension_option =
           (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar9;
      pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar11->super_Chain_column_option).pivot_ = IVar7;
    }
  }
  else {
    pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
               *)(p_Var4 + lVar14);
    if ((pIVar12->super_Chain_column_option).pairedColumn_ != 0xffffffff) {
      local_38 = CONCAT44(local_38._4_4_,columnIndex1);
      local_40.targetColumn._0_4_ = columnIndex1;
      if ((this->deathComp_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_001b386a;
      bVar8 = (*(this->deathComp_)._M_invoker)
                        ((_Any_data *)&this->deathComp_,(uint *)&local_40,&local_44);
      p_Var4 = this[1].deathComp_._M_invoker;
      if (bVar8) {
        lVar10 = (ulong)(pIVar12->super_Chain_column_option).pairedColumn_ * 0x40;
        pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                   *)(p_Var4 + lVar10);
        uVar1 = *(uint *)(p_Var4 + lVar10 + 0x14);
        pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                   *)(p_Var4 + (ulong)(pIVar11->super_Chain_column_option).pairedColumn_ * 0x40);
        local_40.targetColumn = pIVar12;
        bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::___e_matrix::Column_types)7,true,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar11,pIVar12,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar8) {
          CVar6.dim_ = (pIVar12->super_Column_dimension_option).dim_;
          IVar9 = (pIVar12->super_Chain_column_option).pivot_;
          IVar13 = (pIVar11->super_Chain_column_option).pivot_;
          pIVar12->super_Column_dimension_option =
               (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
          (pIVar12->super_Chain_column_option).pivot_ = IVar13;
          pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
          (pIVar11->super_Chain_column_option).pivot_ = IVar9;
        }
        uVar2 = (pIVar12->super_Chain_column_option).pivot_;
        if (uVar1 != uVar2) {
          p_Var5 = this[2].birthComp_.super__Function_base._M_manager;
          uVar3 = *(undefined4 *)(p_Var5 + (ulong)uVar1 * 4);
          *(undefined4 *)(p_Var5 + (ulong)uVar1 * 4) = *(undefined4 *)(p_Var5 + (ulong)uVar2 * 4);
          *(undefined4 *)(p_Var5 + (ulong)uVar2 * 4) = uVar3;
        }
        p_Var4 = this[1].deathComp_._M_invoker;
        pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                   *)(p_Var4 + lVar15);
        IVar13 = *(ID_index *)(p_Var4 + lVar15 + 0x14);
        pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                   *)(p_Var4 + lVar14);
        local_40.targetColumn = pIVar12;
        bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::___e_matrix::Column_types)7,true,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar11,pIVar12,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar8) {
          CVar6.dim_ = (pIVar12->super_Column_dimension_option).dim_;
          IVar7 = (pIVar12->super_Chain_column_option).pivot_;
          IVar9 = (pIVar11->super_Chain_column_option).pivot_;
          pIVar12->super_Column_dimension_option =
               (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
          (pIVar12->super_Chain_column_option).pivot_ = IVar9;
          pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
          (pIVar11->super_Chain_column_option).pivot_ = IVar7;
        }
        IVar9 = (pIVar12->super_Chain_column_option).pivot_;
        if (IVar13 == IVar9) {
          return (Index)local_38;
        }
        goto LAB_001b3840;
      }
      lVar10 = (ulong)(pIVar11->super_Chain_column_option).pairedColumn_ * 0x40;
      pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                 *)(p_Var4 + lVar10);
      local_38 = (ulong)*(uint *)(p_Var4 + lVar10 + 0x14);
      pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_false,_false,_true>_>_>
                 *)(p_Var4 + (ulong)(pIVar12->super_Chain_column_option).pairedColumn_ * 0x40);
      local_40.targetColumn = pIVar11;
      bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::___e_matrix::Column_types)7,true,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar12,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar8) {
        CVar6.dim_ = (pIVar11->super_Column_dimension_option).dim_;
        IVar9 = (pIVar11->super_Chain_column_option).pivot_;
        IVar13 = (pIVar12->super_Chain_column_option).pivot_;
        pIVar11->super_Column_dimension_option =
             (Column_dimension_option)(pIVar12->super_Column_dimension_option).dim_;
        (pIVar11->super_Chain_column_option).pivot_ = IVar13;
        pIVar12->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
        (pIVar12->super_Chain_column_option).pivot_ = IVar9;
      }
      uVar1 = (pIVar11->super_Chain_column_option).pivot_;
      if ((uint)local_38 != uVar1) {
        p_Var5 = this[2].birthComp_.super__Function_base._M_manager;
        uVar3 = *(undefined4 *)(p_Var5 + local_38 * 4);
        *(undefined4 *)(p_Var5 + local_38 * 4) = *(undefined4 *)(p_Var5 + (ulong)uVar1 * 4);
        *(undefined4 *)(p_Var5 + (ulong)uVar1 * 4) = uVar3;
      }
      p_Var4 = this[1].deathComp_._M_invoker;
      IVar13 = *(ID_index *)(p_Var4 + lVar14 + 0x14);
      goto LAB_001b37f8;
    }
    IVar13 = (pIVar12->super_Chain_column_option).pivot_;
    local_40.targetColumn = pIVar12;
    bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::___e_matrix::Column_types)7,true,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar11,pIVar12,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    columnIndex2 = columnIndex1;
    if (bVar8) {
      CVar6.dim_ = (pIVar12->super_Column_dimension_option).dim_;
      IVar7 = (pIVar12->super_Chain_column_option).pivot_;
      IVar9 = (pIVar11->super_Chain_column_option).pivot_;
      pIVar12->super_Column_dimension_option =
           (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar9;
      pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar6.dim_;
      (pIVar11->super_Chain_column_option).pivot_ = IVar7;
    }
  }
  IVar9 = (pIVar12->super_Chain_column_option).pivot_;
  local_38._0_4_ = columnIndex2;
  if (IVar13 == IVar9) {
    return columnIndex2;
  }
LAB_001b3840:
  p_Var5 = this[2].birthComp_.super__Function_base._M_manager;
  uVar3 = *(undefined4 *)(p_Var5 + (ulong)IVar13 * 4);
  *(undefined4 *)(p_Var5 + (ulong)IVar13 * 4) = *(undefined4 *)(p_Var5 + (ulong)IVar9 * 4);
  *(undefined4 *)(p_Var5 + (ulong)IVar9 * 4) = uVar3;
  return (Index)local_38;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}